

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void writeGZ1(char *fileName,half *gPixels,float *zPixels,int width,int height)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  FrameBuffer frameBuffer;
  OutputFile file;
  Header header;
  Slice local_140 [56];
  Slice local_108 [56];
  char local_d0 [48];
  undefined1 local_a0 [36];
  Channel local_7c [28];
  Vec2<float> local_60;
  Header local_58 [60];
  int local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_58,in_ECX,in_R8D,&local_60,0,3);
  pcVar2 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_7c,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar2,(Channel *)"G");
  pcVar2 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)(local_a0 + 0x14),FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar2,(Channel *)0x1206a1);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_a0,local_8,local_58,iVar1);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x10c3b8);
  Imf_3_4::Slice::Slice(local_108,HALF,local_10,2,(long)local_1c * 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_d0,(Slice *)"G");
  Imf_3_4::Slice::Slice(local_140,FLOAT,local_18,4,(long)local_1c << 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_d0,(Slice *)0x1206a1);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_a0);
  Imf_3_4::OutputFile::writePixels((int)local_a0);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10c4bf);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_a0);
  Imf_3_4::Header::~Header(local_58);
  return;
}

Assistant:

void
writeGZ1 (
    const char   fileName[],
    const half*  gPixels,
    const float* zPixels,
    int          width,
    int          height)
{
    //
    // Write an image with only a G (green) and a Z (depth) channel,
    // using class OutputFile.
    //
    //	- create a file header
    //	- add G and Z channels to the header
    //	- open the file, and store the header in the file
    //	- describe the memory layout of the G and Z pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.channels ().insert ("G", Channel (IMF::HALF));
    header.channels ().insert ("Z", Channel (IMF::FLOAT));

    OutputFile file (fileName, header);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                   // type
            (char*) gPixels,             // base
            sizeof (*gPixels) * 1,       // xStride
            sizeof (*gPixels) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                  // type
            (char*) zPixels,             // base
            sizeof (*zPixels) * 1,       // xStride
            sizeof (*zPixels) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.writePixels (height);
}